

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLScanner::scanXMLDecl(XMLScanner *this,DeclTypes type)

{
  XMLDocumentHandler *pXVar1;
  DocTypeHandler *pDVar2;
  bool bVar3;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  XMLReader *this_00;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *local_d8;
  XMLCh *actualEnc;
  int index;
  int curTop;
  XMLCh *rawValue;
  XMLBuffer *pXStack_b8;
  bool skippedSomething;
  XMLBuffer *nameBuf;
  Strings curString;
  int curCount;
  XMLBuffer *buffers [4];
  int flags [4];
  XMLBufBid bbName;
  XMLBufBid bbDummy;
  XMLBufBid bbStand;
  undefined1 local_38 [8];
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  DeclTypes type_local;
  XMLScanner *this_local;
  
  XMLBufBid::XMLBufBid((XMLBufBid *)&bbEncoding.fMgr,&this->fBufMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)local_38,&this->fBufMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)&bbDummy.fMgr,&this->fBufMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)&bbName.fMgr,&this->fBufMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)(flags + 2),&this->fBufMgr);
  buffers[3] = (XMLBuffer *)0xffffffffffffffff;
  flags[0] = -1;
  flags[1] = -1;
  _curString = XMLBufBid::getBuffer((XMLBufBid *)&bbEncoding.fMgr);
  buffers[0] = XMLBufBid::getBuffer((XMLBufBid *)local_38);
  buffers[1] = XMLBufBid::getBuffer((XMLBufBid *)&bbDummy.fMgr);
  buffers[2] = XMLBufBid::getBuffer((XMLBufBid *)&bbName.fMgr);
  nameBuf._4_4_ = 0;
  pXStack_b8 = XMLBufBid::getBuffer((XMLBufBid *)(flags + 2));
  while( true ) {
    ReaderMgr::skipPastSpaces(&this->fReaderMgr,(bool *)((long)&rawValue + 7),true);
    bVar3 = ReaderMgr::lookingAtChar(&this->fReaderMgr,L'?');
    if (bVar3) break;
    if (((rawValue._7_1_ & 1) == 0) && (nameBuf._4_4_ != 0)) {
      emitError(this,ExpectedWhitespace);
    }
    XVar4 = scanUpToWSOr(this,pXStack_b8,L'=');
    if (XVar4 == 0) {
      emitError(this,ExpectedDeclString);
    }
    pXVar5 = XMLBuffer::getRawBuffer(pXStack_b8);
    bVar3 = XMLString::equals(pXVar5,(XMLCh *)XMLUni::fgVersionString);
    if (bVar3) {
      nameBuf._0_4_ = 0;
    }
    else {
      pXVar5 = XMLBuffer::getRawBuffer(pXStack_b8);
      bVar3 = XMLString::equals(pXVar5,(XMLCh *)XMLUni::fgEncodingString);
      if (bVar3) {
        nameBuf._0_4_ = 1;
      }
      else {
        pXVar5 = XMLBuffer::getRawBuffer(pXStack_b8);
        bVar3 = XMLString::equals(pXVar5,(XMLCh *)XMLUni::fgStandaloneString);
        if (bVar3) {
          nameBuf._0_4_ = 2;
        }
        else {
          nameBuf._0_4_ = 3;
        }
      }
    }
    if ((uint)nameBuf == 3) {
      pXVar5 = XMLBuffer::getRawBuffer(pXStack_b8);
      emitError(this,ExpectedDeclString,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    else if (flags[(ulong)(uint)nameBuf - 2] == -1) {
      if (flags[(ulong)(uint)nameBuf - 2] == -1) {
        nameBuf._4_4_ = nameBuf._4_4_ + 1;
        flags[(ulong)(uint)nameBuf - 2] = nameBuf._4_4_;
      }
    }
    else {
      pXVar5 = XMLBuffer::getRawBuffer(pXStack_b8);
      emitError(this,DeclStringRep,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    bVar3 = scanEq(this,true);
    if (!bVar3) {
      emitError(this,ExpectedEqSign);
    }
    bVar3 = getQuotedString(this,*(XMLBuffer **)(&curString + (ulong)(uint)nameBuf * 2));
    if (!bVar3) {
      emitError(this,ExpectedQuotedString);
      ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
      rawValue._0_4_ = 1;
      goto LAB_00385fa1;
    }
    pXVar5 = XMLBuffer::getRawBuffer(*(XMLBuffer **)(&curString + (ulong)(uint)nameBuf * 2));
    if ((uint)nameBuf == 0) {
      bVar3 = XMLString::equals(pXVar5,L"1.1");
      if (bVar3) {
        if (type == Decl_XML) {
          this->fXMLVersion = XMLV1_1;
          ReaderMgr::setXMLVersion(&this->fReaderMgr,XMLV1_1);
        }
        else if (this->fXMLVersion != XMLV1_1) {
          emitError(this,UnsupportedXMLVersion,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else {
        bVar3 = XMLString::equals(pXVar5,L"1.0");
        if (bVar3) {
          if (type == Decl_XML) {
            this->fXMLVersion = XMLV1_0;
            ReaderMgr::setXMLVersion(&this->fReaderMgr,XMLV1_0);
          }
        }
        else {
          bVar3 = XMLString::startsWith(pXVar5,L"1.");
          if (bVar3) {
            if (type == Decl_XML) {
              this->fXMLVersion = XMLV1_0;
              ReaderMgr::setXMLVersion(&this->fReaderMgr,XMLV1_0);
            }
          }
          else {
            emitError(this,UnsupportedXMLVersion,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
    }
    else if ((uint)nameBuf == 1) {
      bVar3 = XMLString::isValidEncName(pXVar5);
      if (!bVar3) {
        emitError(this,BadXMLEncoding,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else if ((uint)nameBuf == 2) {
      bVar3 = XMLString::equals(pXVar5,L"yes");
      if (bVar3) {
        this->fStandalone = true;
      }
      else {
        bVar3 = XMLString::equals(pXVar5,L"no");
        if (bVar3) {
          this->fStandalone = false;
        }
        else {
          emitError(this,BadStandalone);
          XVar4 = XMLBuffer::getLen(*(XMLBuffer **)(&curString + (ulong)(uint)nameBuf * 2));
          if ((((XVar4 == 3) && ((*pXVar5 == L'y' || (*pXVar5 == L'Y')))) &&
              ((pXVar5[1] == L'e' || (pXVar5[1] == L'E')))) &&
             ((pXVar5[2] == L's' || (pXVar5[2] == L'S')))) {
            this->fStandalone = true;
          }
          else {
            XVar4 = XMLBuffer::getLen(*(XMLBuffer **)(&curString + (ulong)(uint)nameBuf * 2));
            if (((XVar4 == 2) && ((*pXVar5 == L'n' || (*pXVar5 == L'N')))) &&
               ((pXVar5[1] == L'o' || (pXVar5[1] == L'O')))) {
              this->fStandalone = false;
            }
          }
        }
      }
    }
  }
  actualEnc._4_4_ = 0;
  actualEnc._0_4_ = 0;
  do {
    if (1 < (int)actualEnc) {
LAB_00385c89:
      if ((type == Decl_XML) && ((int)buffers[3] == -1)) {
        emitError(this,XMLVersionRequired);
      }
      else if (type == Decl_Text) {
        if (flags[0] != -1) {
          emitError(this,StandaloneNotLegal);
        }
        if (buffers[3]._4_4_ == -1) {
          emitError(this,EncodingRequired);
        }
      }
      bVar3 = ReaderMgr::skippedChar(&this->fReaderMgr,L'?');
      if (bVar3) {
        bVar3 = ReaderMgr::skippedChar(&this->fReaderMgr,L'>');
        if (!bVar3) {
          emitError(this,UnterminatedXMLDecl);
          ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
        }
      }
      else {
        emitError(this,UnterminatedXMLDecl);
        ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
      }
      local_d8 = ReaderMgr::getCurrentEncodingStr(&this->fReaderMgr);
      if (buffers[3]._4_4_ != -1) {
        this_00 = ReaderMgr::getCurrentReader(&this->fReaderMgr);
        pXVar5 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
        bVar3 = XMLReader::setEncoding(this_00,pXVar5);
        if (bVar3) {
          local_d8 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
        }
        else {
          pXVar5 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
          emitError(this,ContradictoryEncoding,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      if (type == Decl_XML) {
        if (this->fDocHandler != (XMLDocumentHandler *)0x0) {
          pXVar1 = this->fDocHandler;
          pXVar5 = XMLBufBid::getRawBuffer((XMLBufBid *)&bbEncoding.fMgr);
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
          pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)&bbDummy.fMgr);
          (*pXVar1->_vptr_XMLDocumentHandler[0xd])(pXVar1,pXVar5,pXVar6,pXVar7,local_d8);
        }
      }
      else if ((type == Decl_Text) && (this->fDocTypeHandler != (DocTypeHandler *)0x0)) {
        pDVar2 = this->fDocTypeHandler;
        pXVar5 = XMLBufBid::getRawBuffer((XMLBufBid *)&bbEncoding.fMgr);
        pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_38);
        (*pDVar2->_vptr_DocTypeHandler[0x11])(pDVar2,pXVar5,pXVar6);
      }
      rawValue._0_4_ = 0;
LAB_00385fa1:
      XMLBufBid::~XMLBufBid((XMLBufBid *)(flags + 2));
      XMLBufBid::~XMLBufBid((XMLBufBid *)&bbName.fMgr);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&bbDummy.fMgr);
      XMLBufBid::~XMLBufBid((XMLBufBid *)local_38);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&bbEncoding.fMgr);
      return;
    }
    if (flags[(long)(int)actualEnc + -2] != -1) {
      if (flags[(long)(int)actualEnc + -2] != actualEnc._4_4_ + 1) {
        emitError(this,DeclStringsInWrongOrder);
        goto LAB_00385c89;
      }
      actualEnc._4_4_ = flags[(long)(int)actualEnc + -2];
    }
    actualEnc._0_4_ = (int)actualEnc + 1;
  } while( true );
}

Assistant:

void XMLScanner::scanXMLDecl(const DeclTypes type)
{
    // Get us some buffers to use
    XMLBufBid bbVersion(&fBufMgr);
    XMLBufBid bbEncoding(&fBufMgr);
    XMLBufBid bbStand(&fBufMgr);
    XMLBufBid bbDummy(&fBufMgr);
    XMLBufBid bbName(&fBufMgr);

    //  We use this little enum and array to keep up with what we found
    //  and what order we found them in. This lets us get them free form
    //  without too much overhead, but still know that they were in the
    //  wrong order.
    enum Strings
    {
        VersionString
        , EncodingString
        , StandaloneString
        , UnknownString

        , StringCount
    };
    int flags[StringCount] = { -1, -1, -1, -1 };

    //  Also set up a list of buffers in the right order so that we know
    //  where to put stuff.
    XMLBuffer* buffers[StringCount] ;
    buffers[0] = &bbVersion.getBuffer();
    buffers[1] = &bbEncoding.getBuffer();
    buffers[2] = &bbStand.getBuffer();
    buffers[3] = &bbDummy.getBuffer();

    int curCount = 0;
    Strings curString;
    XMLBuffer& nameBuf = bbName.getBuffer();
    while (true)
    {
        // Skip any spaces
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, true);

        // If we are looking at a question mark, then break out
        if (fReaderMgr.lookingAtChar(chQuestion))
            break;

        // If this is not the first string, then we require the spaces
        if (!skippedSomething && curCount)
            emitError(XMLErrs::ExpectedWhitespace);

        //  Get characters up to the next whitespace or equal's sign.
        if (!scanUpToWSOr(nameBuf, chEqual))
            emitError(XMLErrs::ExpectedDeclString);

        // See if it matches any of our expected strings
        if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgVersionString))
            curString = VersionString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgEncodingString))
            curString = EncodingString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgStandaloneString))
            curString = StandaloneString;
        else
            curString = UnknownString;

        //  If its an unknown string, then give that error. Else check to
        //  see if this one has been done already and give that error.
        if (curString == UnknownString)
            emitError(XMLErrs::ExpectedDeclString, nameBuf.getRawBuffer());
        else if (flags[curString] != -1)
            emitError(XMLErrs::DeclStringRep, nameBuf.getRawBuffer());
        else if (flags[curString] == -1)
            flags[curString] = ++curCount;

        //  Scan for an equal's sign. If we don't find it, issue an error
        //  but keep trying to go on.
        if (!scanEq(true))
            emitError(XMLErrs::ExpectedEqSign);

        //  Get a quote string into the buffer for the string that we are
        //  currently working on.
        if (!getQuotedString(*buffers[curString]))
        {
            emitError(XMLErrs::ExpectedQuotedString);
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // And validate the value according which one it was
        const XMLCh* rawValue = buffers[curString]->getRawBuffer();
        if (curString == VersionString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgVersion1_1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_1;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_1);
                }
                else {
                    if (fXMLVersion != XMLReader::XMLV1_1)
                        emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
                }
            }
            else if (XMLString::equals(rawValue, XMLUni::fgVersion1_0)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else if (XMLString::startsWith(rawValue, XMLUni::fgVersion1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else
                emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
        }
         else if (curString == EncodingString)
        {
            if (!XMLString::isValidEncName(rawValue))
                emitError(XMLErrs::BadXMLEncoding, rawValue);
        }
         else if (curString == StandaloneString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgYesString))
                fStandalone = true;
            else if (XMLString::equals(rawValue, XMLUni::fgNoString))
                fStandalone = false;
            else
            {
                emitError(XMLErrs::BadStandalone);
                //if (!XMLString::compareIString(rawValue, XMLUni::fgYesString))
                //else if (!XMLString::compareIString(rawValue, XMLUni::fgNoString))
                if (buffers[curString]->getLen() == 3 &&
                    (((rawValue[0] == chLatin_y) || (rawValue[0] == chLatin_Y)) &&
                     ((rawValue[1] == chLatin_e) || (rawValue[1] == chLatin_E)) &&
                     ((rawValue[2] == chLatin_s) || (rawValue[2] == chLatin_S))))
                    fStandalone = true;
                else if (buffers[curString]->getLen() == 2 &&
                    (((rawValue[0] == chLatin_n) || (rawValue[0] == chLatin_N)) &&
                     ((rawValue[1] == chLatin_o) || (rawValue[1] == chLatin_O))))
                    fStandalone = false;
            }
        }
    }

    //  Make sure that the strings present are in order. We don't care about
    //  which ones are present at this point, just that any there are in the
    //  right order.
    int curTop = 0;
    for (int index = VersionString; index < StandaloneString; index++)
    {
        if (flags[index] != -1)
        {
            if (flags[index] !=  curTop + 1)
            {
                emitError(XMLErrs::DeclStringsInWrongOrder);
                break;
            }
            curTop = flags[index];
        }
    }

    //  If its an XML decl, the version must be present.
    //  If its a Text decl, then encoding must be present AND standalone must not be present.
    if ((type == Decl_XML) && (flags[VersionString] == -1))
        emitError(XMLErrs::XMLVersionRequired);
    else if (type == Decl_Text) {
        if (flags[StandaloneString] != -1)
            emitError(XMLErrs::StandaloneNotLegal);
        if (flags[EncodingString] == -1)
            emitError(XMLErrs::EncodingRequired);
    }

    if (!fReaderMgr.skippedChar(chQuestion))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }

    //  Do this before we possibly update the reader with the
    //  actual encoding string. Otherwise, we will pass the wrong thing
    //  for the last parameter!
    const XMLCh* actualEnc = fReaderMgr.getCurrentEncodingStr();

    //  Ok, we've now seen the real encoding string, if there was one, so
    //  lets call back on the current reader and tell it what the real
    //  encoding string was. If it fails, that's because it represents some
    //  sort of contradiction with the autosensed format, and it keeps the
    //  original encoding.
    //
    //  NOTE: This can fail for a number of reasons, such as a bogus encoding
    //  name or because its in flagrant contradiction of the auto-sensed
    //  format.
    if (flags[EncodingString] != -1)
    {
        if (!fReaderMgr.getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
        else
            actualEnc = bbEncoding.getRawBuffer();
    }

    //  If we have a document handler then call the XML Decl callback.
    if (type == Decl_XML)
    {
        if (fDocHandler)
            fDocHandler->XMLDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
                , bbStand.getRawBuffer()
                , actualEnc
            );
    }
    else if (type == Decl_Text)
    {
        if (fDocTypeHandler)
            fDocTypeHandler->TextDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
            );
    }
}